

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.c
# Opt level: O0

int wally_psbt_from_bytes(uchar *bytes,size_t len,wally_psbt **output)

{
  int iVar1;
  uint32_t uVar2;
  uint64_t uVar3;
  wally_tx *local_80;
  wally_tx *tx;
  size_t val_max;
  uchar *val;
  uchar *key;
  uint32_t pre144flag;
  uint32_t flags;
  wally_psbt *result;
  size_t key_len;
  size_t i;
  uchar *puStack_38;
  int ret;
  uchar *pre_key;
  uchar *magic;
  wally_psbt **output_local;
  size_t len_local;
  uchar *bytes_local;
  
  _pre144flag = (wally_psbt *)0x0;
  key._4_4_ = 0;
  key._0_4_ = 8;
  if (output == (wally_psbt **)0x0) {
    return -2;
  }
  *output = (wally_psbt *)0x0;
  magic = (uchar *)output;
  output_local = (wally_psbt **)len;
  len_local = (size_t)bytes;
  pre_key = pull_skip((uchar **)&len_local,(size_t *)&output_local,5);
  if (pre_key == (uchar *)0x0) {
    i._4_4_ = -2;
  }
  else {
    iVar1 = memcmp(pre_key,PSBT_MAGIC,5);
    if (iVar1 != 0) {
      iVar1 = memcmp(pre_key,PSET_MAGIC,5);
      if (iVar1 != 0) {
        i._4_4_ = -2;
        goto LAB_00176db3;
      }
      key._4_4_ = key._4_4_ | 2;
      key._0_4_ = 0;
    }
    i._4_4_ = wally_psbt_init_alloc(0,0,0,8,(wally_psbt **)&pre144flag);
    if (i._4_4_ == 0) {
      *(undefined4 *)_pre144flag->magic = *(undefined4 *)pre_key;
      _pre144flag->magic[4] = pre_key[4];
      i._4_4_ = 0;
      do {
        while( true ) {
          while( true ) {
            puStack_38 = (uchar *)len_local;
            result = (wally_psbt *)pull_varlength((uchar **)&len_local,(size_t *)&output_local);
            if (result == (wally_psbt *)0x0) {
              if (len_local == 0) {
                i._4_4_ = -2;
                goto LAB_00176db3;
              }
              if (_pre144flag->tx != (wally_tx *)0x0) {
                key_len = 0;
                goto LAB_00176ce7;
              }
              i._4_4_ = -2;
              goto LAB_00176db3;
            }
            pull_subfield_start((uchar **)&len_local,(size_t *)&output_local,(size_t)result,&val,
                                (size_t *)&result);
            uVar3 = pull_varint(&val,(size_t *)&result);
            if (uVar3 != 0) break;
            subfield_nomore_end((uchar **)&len_local,(size_t *)&output_local,val,(size_t)result);
            uVar3 = pull_varint((uchar **)&len_local,(size_t *)&output_local);
            pull_subfield_start((uchar **)&len_local,(size_t *)&output_local,uVar3,
                                (uchar **)&val_max,(size_t *)&tx);
            i._4_4_ = wally_tx_from_bytes((uchar *)val_max,(size_t)tx,key._4_4_ | (uint)key,
                                          &local_80);
            if ((i._4_4_ == 0) &&
               (i._4_4_ = psbt_set_global_tx(_pre144flag,local_80,false), i._4_4_ != 0)) {
              wally_tx_free(local_80);
            }
            if (i._4_4_ != 0) goto LAB_00176db3;
            pull_subfield_end((uchar **)&len_local,(size_t *)&output_local,(uchar *)val_max,
                              (size_t)tx);
          }
          if (uVar3 == 0xfb) break;
          i._4_4_ = pull_unknown_key_value
                              ((uchar **)&len_local,(size_t *)&output_local,puStack_38,
                               &_pre144flag->unknowns);
          if (i._4_4_ != 0) goto LAB_00176db3;
          i._4_4_ = 0;
        }
        if (_pre144flag->version != 0) {
          i._4_4_ = -2;
          goto LAB_00176db3;
        }
        subfield_nomore_end((uchar **)&len_local,(size_t *)&output_local,val,(size_t)result);
        uVar3 = pull_varint((uchar **)&len_local,(size_t *)&output_local);
        pull_subfield_start((uchar **)&len_local,(size_t *)&output_local,uVar3,(uchar **)&val_max,
                            (size_t *)&tx);
        uVar2 = pull_le32((uchar **)&val_max,(size_t *)&tx);
        _pre144flag->version = uVar2;
        subfield_nomore_end((uchar **)&len_local,(size_t *)&output_local,(uchar *)val_max,(size_t)tx
                           );
      } while (_pre144flag->version == 0);
      i._4_4_ = -2;
    }
  }
  goto LAB_00176db3;
LAB_00176ce7:
  if (_pre144flag->tx->num_inputs <= key_len) goto LAB_00176d3a;
  i._4_4_ = pull_psbt_input((uchar **)&len_local,(size_t *)&output_local,key._4_4_,
                            _pre144flag->inputs + key_len);
  if (i._4_4_ != 0) goto LAB_00176db3;
  key_len = key_len + 1;
  i._4_4_ = 0;
  goto LAB_00176ce7;
LAB_00176d3a:
  for (key_len = 0; key_len < _pre144flag->tx->num_outputs; key_len = key_len + 1) {
    i._4_4_ = pull_psbt_output((uchar **)&len_local,(size_t *)&output_local,
                               _pre144flag->outputs + key_len);
    if (i._4_4_ != 0) goto LAB_00176db3;
    i._4_4_ = 0;
  }
  if (len_local != 0) {
    *(wally_psbt **)magic = _pre144flag;
    return 0;
  }
  i._4_4_ = -2;
LAB_00176db3:
  wally_psbt_free(_pre144flag);
  return i._4_4_;
}

Assistant:

int wally_psbt_from_bytes(const unsigned char *bytes, size_t len,
                          struct wally_psbt **output)
{
    const unsigned char *magic, *pre_key;
    int ret;
    size_t i, key_len;
    struct wally_psbt *result = NULL;
    uint32_t flags = 0, pre144flag = WALLY_TX_FLAG_PRE_BIP144;

    TX_CHECK_OUTPUT;

    magic = pull_skip(&bytes, &len, sizeof(PSBT_MAGIC));
    if (!magic) {
        ret = WALLY_EINVAL;  /* Not enough bytes */
        goto fail;
    }
    if (memcmp(magic, PSBT_MAGIC, sizeof(PSBT_MAGIC)) != 0 ) {
#ifdef BUILD_ELEMENTS
        if (memcmp(magic, PSET_MAGIC, sizeof(PSET_MAGIC)) != 0) {
            ret = WALLY_EINVAL;  /* Invalid Magic */
            goto fail;
        }
        flags |= WALLY_TX_FLAG_USE_ELEMENTS;
        pre144flag = 0;
#else
        ret = WALLY_EINVAL;  /* Invalid Magic */
        goto fail;
#endif /* BUILD_ELEMENTS */
    }

    /* Make the wally_psbt */
    if ((ret = wally_psbt_init_alloc(0, 0, 0, 8, &result)) != WALLY_OK)
        goto fail;

    /* Set the magic */
    memcpy(result->magic, magic, sizeof(PSBT_MAGIC));

    /* Read globals first */
    pre_key = bytes;
    while ((key_len = pull_varlength(&bytes, &len)) != 0) {
        const unsigned char *key, *val;
        size_t val_max;

        /* Start parsing key */
        pull_subfield_start(&bytes, &len, key_len, &key, &key_len);

        /* Process based on type */
        switch (pull_varint(&key, &key_len)) {
        case PSBT_GLOBAL_UNSIGNED_TX: {
            struct wally_tx *tx;

            subfield_nomore_end(&bytes, &len, key, key_len);

            /* Start parsing the value field. */
            pull_subfield_start(&bytes, &len,
                                pull_varint(&bytes, &len),
                                &val, &val_max);
            ret = wally_tx_from_bytes(val, val_max, flags | pre144flag, &tx);
            if (ret == WALLY_OK) {
                ret = psbt_set_global_tx(result, tx, false);
                if (ret != WALLY_OK)
                    wally_tx_free(tx);
            }
            if (ret != WALLY_OK)
                goto fail;
            pull_subfield_end(&bytes, &len, val, val_max);
            break;
        }
        case PSBT_GLOBAL_VERSION: {
            if (result->version > 0) {
                ret = WALLY_EINVAL;    /* Version already provided */
                goto fail;
            }
            subfield_nomore_end(&bytes, &len, key, key_len);

            /* Start parsing the value field. */
            pull_subfield_start(&bytes, &len,
                                pull_varint(&bytes, &len),
                                &val, &val_max);
            result->version = pull_le32(&val, &val_max);
            subfield_nomore_end(&bytes, &len, val, val_max);
            if (result->version > WALLY_PSBT_HIGHEST_VERSION) {
                ret = WALLY_EINVAL;    /* Unsupported version number */
                goto fail;
            }
            break;
        }
        /* Unknowns */
        default: {
            ret = pull_unknown_key_value(&bytes, &len, pre_key, &result->unknowns);
            if (ret != WALLY_OK)
                goto fail;
            break;
        }
        }
        pre_key = bytes;
    }

    /* We don't technically need to test here, but it's a minor optimization */
    if (!bytes) {
        ret = WALLY_EINVAL; /* Missing global separator */
        goto fail;
    }

    if (!result->tx) {
        ret = WALLY_EINVAL; /* No global tx */
        goto fail;
    }

    /* Read inputs */
    for (i = 0; i < result->tx->num_inputs; ++i) {
        ret = pull_psbt_input(&bytes, &len, flags, &result->inputs[i]);
        if (ret != WALLY_OK)
            goto fail;
    }

    /* Read outputs */
    for (i = 0; i < result->tx->num_outputs; ++i) {
        ret = pull_psbt_output(&bytes, &len, &result->outputs[i]);
        if (ret != WALLY_OK)
            goto fail;
    }

    /* If we ran out of data anywhere, fail. */
    if (!bytes) {
        ret = WALLY_EINVAL;
        goto fail;
    }

    *output = result;
    return WALLY_OK;

fail:
    wally_psbt_free(result);
    return ret;
}